

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

Interval * __thiscall
deqp::gls::BuiltinPrecisionTests::Functions::Round::applyPoint
          (Interval *__return_storage_ptr__,Round *this,EvalContext *param_1,double x)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double truncated;
  double local_10;
  
  local_10 = 0.0;
  dVar4 = modf(x,&local_10);
  __return_storage_ptr__->m_hasNaN = false;
  __return_storage_ptr__->m_lo = INFINITY;
  __return_storage_ptr__->m_hi = -INFINITY;
  if (ABS(dVar4) <= 0.5) {
    bVar1 = NAN(local_10);
    dVar6 = INFINITY;
    if (!bVar1) {
      dVar6 = local_10;
    }
    dVar7 = -INFINITY;
    if (!bVar1) {
      dVar7 = local_10;
    }
    __return_storage_ptr__->m_hasNaN = bVar1;
    dVar5 = INFINITY;
    if (dVar6 <= INFINITY) {
      dVar5 = dVar6;
    }
    dVar6 = -INFINITY;
    if (-INFINITY <= dVar7) {
      dVar6 = dVar7;
    }
    __return_storage_ptr__->m_lo = dVar5;
    __return_storage_ptr__->m_hi = dVar6;
  }
  if (0.5 <= ABS(dVar4)) {
    local_10 = (double)(int)((uint)(0.0 < dVar4) - (uint)(dVar4 < 0.0)) + local_10;
    bVar1 = NAN(local_10);
    dVar4 = local_10;
    if (bVar1) {
      local_10 = -INFINITY;
      dVar4 = INFINITY;
    }
    uVar2 = -(ulong)(__return_storage_ptr__->m_lo <= dVar4);
    uVar3 = -(ulong)(local_10 <= __return_storage_ptr__->m_hi);
    __return_storage_ptr__->m_hasNaN = (bool)(bVar1 | __return_storage_ptr__->m_hasNaN & 1U);
    __return_storage_ptr__->m_lo =
         (double)(uVar2 & (ulong)__return_storage_ptr__->m_lo | ~uVar2 & (ulong)dVar4);
    __return_storage_ptr__->m_hi =
         (double)(uVar3 & (ulong)__return_storage_ptr__->m_hi | ~uVar3 & (ulong)local_10);
  }
  return __return_storage_ptr__;
}

Assistant:

Interval	applyPoint	(const EvalContext&, double x) const
	{
		double			truncated	= 0.0;
		const double	fract		= deModf(x, &truncated);
		Interval		ret;

		if (fabs(fract) <= 0.5)
			ret |= truncated;
		if (fabs(fract) >= 0.5)
			ret |= truncated + deSign(fract);

		return ret;
	}